

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

double __thiscall VCClusterQuad::energyWithoutItem(VCClusterQuad *this,VCFace *f)

{
  double dVar1;
  double dVar2;
  ResScalar RVar3;
  ResScalar RVar4;
  Vector3d zi;
  Vector3d ws;
  Matrix4d Eo;
  undefined1 local_e0 [32];
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_c0 [24];
  Matrix<double,_4,_4,_0,_4,_4> local_a8;
  
  dVar1 = 0.0;
  if (1 < (this->super_VCCluster).items._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    local_e0._0_8_ = &(this->super_VCCluster).E;
    local_e0._8_8_ = &f->E;
    Eigen::internal::
    assign_innervec_CompleteUnrolling<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0,_16>
    ::run(&local_a8,
          (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
           *)local_e0);
    local_e0._0_8_ = &(this->super_VCCluster).weightedSum;
    local_e0._8_8_ = &f->center;
    local_e0._16_8_ = f->area;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              (local_c0,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                         *)local_e0);
    dVar2 = (this->super_VCCluster).area - f->area;
    center((Vector3d *)local_e0,this,&local_a8);
    dVar1 = 0.0;
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      RVar3 = Eigen::internal::
              dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
              ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_e0,
                    (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_e0);
      RVar4 = Eigen::internal::
              dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
              ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_e0,
                    (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_c0);
      dVar1 = dVar2 * RVar3 - (RVar4 + RVar4);
    }
  }
  return dVar1;
}

Assistant:

double VCClusterQuad::energyWithoutItem(VCFace* f) {
	if (items.size() <= 1)
		return ENG_NULL;
	Matrix4d Eo = E - f->E;
	Vector3d ws = weightedSum - f->center * f->area;
	double a = area - f->area;
	Vector3d zi = center(Eo);
	return a == 0 ? ENG_NULL : a * zi.dot(zi) - 2 * zi.dot(ws);
}